

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaInfo.hpp
# Opt level: O3

void __thiscall
xercesc_4_0::SchemaInfo::addRecursingType(SchemaInfo *this,DOMElement *elem,XMLCh *name)

{
  MemoryManager *pMVar1;
  XMLSize_t XVar2;
  int iVar3;
  ValueVectorOf<const_xercesc_4_0::DOMElement_*> *pVVar4;
  undefined4 extraout_var;
  ValueVectorOf<const_char16_t_*> *pVVar5;
  undefined4 extraout_var_00;
  
  pVVar4 = this->fRecursingAnonTypes;
  if (pVVar4 == (ValueVectorOf<const_xercesc_4_0::DOMElement_*> *)0x0) {
    pVVar4 = (ValueVectorOf<const_xercesc_4_0::DOMElement_*> *)
             XMemory::operator_new(0x28,this->fMemoryManager);
    pMVar1 = this->fMemoryManager;
    pVVar4->fCallDestructor = false;
    pVVar4->fCurCount = 0;
    pVVar4->fMaxCount = 8;
    pVVar4->fElemList = (DOMElement **)0x0;
    pVVar4->fMemoryManager = pMVar1;
    iVar3 = (*pMVar1->_vptr_MemoryManager[3])();
    pVVar4->fElemList = (DOMElement **)CONCAT44(extraout_var,iVar3);
    memset((DOMElement **)CONCAT44(extraout_var,iVar3),0,pVVar4->fMaxCount << 3);
    this->fRecursingAnonTypes = pVVar4;
    pVVar5 = (ValueVectorOf<const_char16_t_*> *)XMemory::operator_new(0x28,this->fMemoryManager);
    pMVar1 = this->fMemoryManager;
    pVVar5->fCallDestructor = false;
    pVVar5->fCurCount = 0;
    pVVar5->fMaxCount = 8;
    pVVar5->fElemList = (char16_t **)0x0;
    pVVar5->fMemoryManager = pMVar1;
    iVar3 = (*pMVar1->_vptr_MemoryManager[3])();
    pVVar5->fElemList = (char16_t **)CONCAT44(extraout_var_00,iVar3);
    memset((char16_t **)CONCAT44(extraout_var_00,iVar3),0,pVVar5->fMaxCount << 3);
    this->fRecursingTypeNames = pVVar5;
    pVVar4 = this->fRecursingAnonTypes;
  }
  ValueVectorOf<const_xercesc_4_0::DOMElement_*>::ensureExtraCapacity(pVVar4,1);
  XVar2 = pVVar4->fCurCount;
  pVVar4->fCurCount = XVar2 + 1;
  pVVar4->fElemList[XVar2] = elem;
  pVVar5 = this->fRecursingTypeNames;
  ValueVectorOf<const_char16_t_*>::ensureExtraCapacity(pVVar5,1);
  XVar2 = pVVar5->fCurCount;
  pVVar5->fCurCount = XVar2 + 1;
  pVVar5->fElemList[XVar2] = name;
  return;
}

Assistant:

inline void SchemaInfo::addRecursingType(const DOMElement* const elem,
                                         const XMLCh* const name) {

    if (!fRecursingAnonTypes) {
        fRecursingAnonTypes = new (fMemoryManager) ValueVectorOf<const DOMElement*>(8, fMemoryManager);
        fRecursingTypeNames = new (fMemoryManager) ValueVectorOf<const XMLCh*>(8, fMemoryManager);
    }

    fRecursingAnonTypes->addElement(elem);
    fRecursingTypeNames->addElement(name);
}